

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

CodeLocation __thiscall
soul::CodeLocation::getOffset(CodeLocation *this,uint32_t linesToAdd,uint32_t columnsToAdd)

{
  Ptr PVar1;
  UnicodeChar UVar2;
  int in_ECX;
  UTF8Reader extraout_RDX;
  uint32_t uVar3;
  undefined4 in_register_00000034;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  CodeLocation CVar9;
  RefCountedPtr<soul::SourceCodeText> local_48;
  UTF8Reader UStack_40;
  Ptr local_38;
  
  local_48.object = *(SourceCodeText **)CONCAT44(in_register_00000034,linesToAdd);
  if (local_48.object != (SourceCodeText *)0x0) {
    ((local_48.object)->super_RefCountedObject).refCount =
         ((local_48.object)->super_RefCountedObject).refCount + 1;
  }
  UStack_40.data = *(char **)(CONCAT44(in_register_00000034,linesToAdd) + 8);
  iVar4 = 0;
  uVar3 = 0;
  local_38.object = (SourceCodeText *)this;
  do {
    PVar1.object = local_38.object;
    if (iVar4 == in_ECX && uVar3 == columnsToAdd) {
      uVar5 = local_48.object._0_4_;
      uVar6 = local_48.object._4_4_;
      local_48.object = (SourceCodeText *)0x0;
      uVar7 = UStack_40.data._0_4_;
      uVar8 = UStack_40.data._4_4_;
LAB_001ea105:
      *(undefined4 *)&((Ptr *)&(local_38.object)->super_RefCountedObject)->object = uVar5;
      *(undefined4 *)&(local_38.object)->field_0x4 = uVar6;
      *(undefined4 *)&((local_38.object)->filename)._M_dataplus._M_p = uVar7;
      *(undefined4 *)((long)&((local_38.object)->filename)._M_dataplus._M_p + 4) = uVar8;
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_48);
      CVar9.location.data = extraout_RDX.data;
      CVar9.sourceCode.object = PVar1.object;
      return CVar9;
    }
    if (*UStack_40.data == '\0') {
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      goto LAB_001ea105;
    }
    iVar4 = iVar4 + 1;
    UVar2 = UTF8Reader::operator*(&UStack_40);
    if (UVar2 == 10) {
      iVar4 = 0;
    }
    uVar3 = uVar3 + (UVar2 == 10);
    UTF8Reader::operator++(&UStack_40);
  } while( true );
}

Assistant:

CodeLocation CodeLocation::getOffset (uint32_t linesToAdd, uint32_t columnsToAdd) const
{
    auto l = *this;
    LineAndColumn lc;

    for (;;)
    {
        if (lc.line == linesToAdd && lc.column == columnsToAdd)
            return l;

        if (l.location.isEmpty())
            return {};

        ++lc.column;
        if (*(l.location) == '\n')  { lc.column = 0; lc.line++; }
        ++(l.location);
    }
}